

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O2

MatrixXd * __thiscall
mnf::CartesianProduct::diffPseudoLog0_
          (MatrixXd *__return_storage_ptr__,CartesianProduct *this,ConstRefVec *x)

{
  pointer psVar1;
  Manifold *this_00;
  long lVar2;
  ulong i;
  MatrixXd local_108;
  ConstRefVec local_f0;
  Type local_c8;
  RefMat local_90;
  Index local_68 [7];
  
  local_68[0] = Manifold::tangentDim(&this->super_Manifold);
  local_c8.
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
  .m_data = (PointerType)Manifold::representationDim(&this->super_Manifold);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,local_68,(long *)&local_c8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__);
  lVar2 = 0;
  for (i = 0; psVar1 = (this->subManifolds_).
                       super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
      i < (ulong)((long)(this->subManifolds_).
                        super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4); i = i + 1)
  {
    this_00 = *(Manifold **)
               ((long)&(psVar1->super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar2);
    Manifold::getConstView<0>((ConstSegment *)local_68,&this->super_Manifold,x,i);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_f0,
               (DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)local_68,(type *)0x0);
    Manifold::diffPseudoLog0(&local_108,this_00,&local_f0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_90,
               &__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(type *)0x0);
    Manifold::getView<1,0>(&local_c8,&this->super_Manifold,&local_90,i);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&local_c8,&local_108);
    free(local_108.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free(local_f0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    lVar2 = lVar2 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd CartesianProduct::diffPseudoLog0_(const ConstRefVec& x) const
{
  Eigen::MatrixXd J(tangentDim(), representationDim());
  J.setZero();
  for (size_t i = 0; i < subManifolds_.size(); ++i)
  {
    getView<T, R>(J, i) =
        subManifolds_[i]->diffPseudoLog0(getConstView<R>(x, i));
  }
  return J;
}